

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderIncompleteGSTest::initTestRuns(GeometryShaderIncompleteGSTest *this)

{
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  *this_00;
  pointer *pp_Var1;
  iterator iVar2;
  _run local_1f;
  _run local_1c;
  _run local_19;
  _run local_16;
  _run local_13;
  
  this_00 = &this->m_test_runs;
  local_13.is_input_primitive_type_defined = false;
  local_13.is_max_vertices_defined = false;
  local_13.is_output_primitive_type_defined = false;
  iVar2._M_current =
       (this->m_test_runs).
       super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,iVar2,&local_13);
  }
  else {
    (iVar2._M_current)->is_output_primitive_type_defined = false;
    (iVar2._M_current)->is_input_primitive_type_defined = false;
    (iVar2._M_current)->is_max_vertices_defined = false;
    pp_Var1 = &(this->m_test_runs).
               super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  local_16.is_input_primitive_type_defined = false;
  local_16.is_max_vertices_defined = false;
  local_16.is_output_primitive_type_defined = true;
  iVar2._M_current =
       (this->m_test_runs).
       super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,iVar2,&local_16);
  }
  else {
    (iVar2._M_current)->is_output_primitive_type_defined = true;
    (iVar2._M_current)->is_input_primitive_type_defined = false;
    (iVar2._M_current)->is_max_vertices_defined = false;
    pp_Var1 = &(this->m_test_runs).
               super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  local_19.is_input_primitive_type_defined = false;
  local_19.is_max_vertices_defined = true;
  local_19.is_output_primitive_type_defined = false;
  iVar2._M_current =
       (this->m_test_runs).
       super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,iVar2,&local_19);
  }
  else {
    (iVar2._M_current)->is_output_primitive_type_defined = false;
    (iVar2._M_current)->is_input_primitive_type_defined = false;
    (iVar2._M_current)->is_max_vertices_defined = true;
    pp_Var1 = &(this->m_test_runs).
               super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  local_1c.is_input_primitive_type_defined = true;
  local_1c.is_max_vertices_defined = true;
  local_1c.is_output_primitive_type_defined = false;
  iVar2._M_current =
       (this->m_test_runs).
       super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,iVar2,&local_1c);
  }
  else {
    (iVar2._M_current)->is_output_primitive_type_defined = false;
    (iVar2._M_current)->is_input_primitive_type_defined = true;
    (iVar2._M_current)->is_max_vertices_defined = true;
    pp_Var1 = &(this->m_test_runs).
               super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  local_1f.is_input_primitive_type_defined = false;
  local_1f.is_max_vertices_defined = true;
  local_1f.is_output_primitive_type_defined = true;
  iVar2._M_current =
       (this->m_test_runs).
       super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
    ::_M_realloc_insert<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,iVar2,&local_1f);
  }
  else {
    (iVar2._M_current)->is_output_primitive_type_defined = true;
    (iVar2._M_current)->is_input_primitive_type_defined = false;
    (iVar2._M_current)->is_max_vertices_defined = true;
    pp_Var1 = &(this->m_test_runs).
               super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  return;
}

Assistant:

void GeometryShaderIncompleteGSTest::initTestRuns()
{
	/*                         input_primitive_defined | max_vertices_defined | output_primitive_defined
	 *                         ------------------------|----------------------|-------------------------*/
	m_test_runs.push_back(_run(false, false, false));
	m_test_runs.push_back(_run(false, false, true));
	m_test_runs.push_back(_run(false, true, false));
	m_test_runs.push_back(_run(true, true, false));
	m_test_runs.push_back(_run(false, true, true));
}